

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialize_model<_IO_FILE*,short,unsigned_int>
               (IsoForest *model,_IO_FILE **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian,bool lacks_range_penalty,bool lacks_scoring_metric)

{
  bool bVar1;
  undefined4 in_ECX;
  __normal_iterator<IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_> *in_RDX;
  vector<char,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  uint in_R8D;
  byte in_R9B;
  IsoTree *node;
  iterator __end2;
  iterator __begin2;
  vector<IsoTree,_std::allocator<IsoTree>_> *__range2;
  vector<IsoTree,_std::allocator<IsoTree>_> *tree;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *__range1;
  size_t veclen;
  size_t data_sizets [2];
  double data_doubles [2];
  uint8_t data_en_2;
  uint8_t data_en_1 [4];
  uint8_t data_en [3];
  reference in_stack_ffffffffffffff70;
  iterator in_stack_ffffffffffffff78;
  iterator in_stack_ffffffffffffff80;
  __normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
  local_60;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  _IO_FILE **in_stack_ffffffffffffffb8;
  IsoTree *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  undefined8 local_30;
  byte local_23;
  byte local_22;
  byte local_21;
  byte local_20;
  char local_1f;
  byte local_1e;
  byte local_1d;
  byte local_1c;
  
  if (!interrupt_switch) {
    if ((in_R8D & 1) == 0) {
      read_bytes<unsigned_char>(in_stack_ffffffffffffff70,(size_t)in_RSI,(FILE **)in_RDX);
      *(uint *)(in_RDI + 0x18) = (uint)local_22;
      *(uint *)(in_RDI + 0x1c) = (uint)local_21;
      *(uint *)(in_RDI + 0x20) = (uint)local_20;
      *(bool *)(in_RDI + 0x40) = local_1f != '\0';
    }
    else {
      read_bytes<unsigned_char>(in_stack_ffffffffffffff70,(size_t)in_RSI,(FILE **)in_RDX);
      *(uint *)(in_RDI + 0x18) = (uint)local_1e;
      *(uint *)(in_RDI + 0x1c) = (uint)local_1d;
      *(uint *)(in_RDI + 0x20) = (uint)local_1c;
    }
    if ((in_R9B & 1) == 0) {
      read_bytes<unsigned_char>(in_stack_ffffffffffffff70,(size_t)in_RSI,(FILE **)in_RDX);
      *(uint *)(in_RDI + 0x24) = (uint)local_23;
    }
    else {
      *(undefined4 *)(in_RDI + 0x24) = 0;
    }
    read_bytes<double,double>
              (in_stack_ffffffffffffff80._M_current,(size_t)in_stack_ffffffffffffff78._M_current,
               (FILE **)in_stack_ffffffffffffff70,in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
    *(undefined8 *)(in_RDI + 0x28) = local_38;
    *(undefined8 *)(in_RDI + 0x30) = local_30;
    read_bytes<unsigned_long,unsigned_int>
              (in_stack_ffffffffffffff80._M_current,(size_t)in_stack_ffffffffffffff78._M_current,
               (FILE **)in_stack_ffffffffffffff70,in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
    *(_IO_FILE ***)(in_RDI + 0x38) = in_stack_ffffffffffffffb8;
    std::
    vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
    ::resize((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
              *)in_stack_ffffffffffffff80._M_current,(size_type)in_stack_ffffffffffffff78._M_current
            );
    std::
    vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
    ::shrink_to_fit((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                     *)0x660a2f);
    local_60._M_current =
         (vector<IsoTree,_std::allocator<IsoTree>_> *)
         std::
         vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
         ::begin((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  *)CONCAT44(in_ECX,in_R8D));
    std::
    vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
    ::end((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
           *)CONCAT44(in_ECX,in_R8D));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
                               *)in_RDX,
                              (__normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
                               *)CONCAT44(in_ECX,in_R8D)), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
      ::operator*(&local_60);
      read_bytes<unsigned_long,unsigned_int>
                (in_stack_ffffffffffffff80._M_current,(size_t)in_stack_ffffffffffffff78._M_current,
                 (FILE **)in_stack_ffffffffffffff70,in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
      std::vector<IsoTree,_std::allocator<IsoTree>_>::resize
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_stack_ffffffffffffff80._M_current,
                 (size_type)in_stack_ffffffffffffff78._M_current);
      std::vector<IsoTree,_std::allocator<IsoTree>_>::shrink_to_fit
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)0x660ac6);
      in_stack_ffffffffffffff80 =
           std::vector<IsoTree,_std::allocator<IsoTree>_>::begin
                     ((vector<IsoTree,_std::allocator<IsoTree>_> *)CONCAT44(in_ECX,in_R8D));
      in_stack_ffffffffffffff78 =
           std::vector<IsoTree,_std::allocator<IsoTree>_>::end
                     ((vector<IsoTree,_std::allocator<IsoTree>_> *)CONCAT44(in_ECX,in_R8D));
      while (bVar1 = __gnu_cxx::operator!=
                               (in_RDX,(__normal_iterator<IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>
                                        *)CONCAT44(in_ECX,in_R8D)), bVar1) {
        in_stack_ffffffffffffff70 =
             __gnu_cxx::
             __normal_iterator<IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>::
             operator*((__normal_iterator<IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>
                        *)&stack0xffffffffffffff80);
        deserialize_node<_IO_FILE*,short,unsigned_int>
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                   SUB81((ulong)in_RDI >> 0x38,0));
        __gnu_cxx::__normal_iterator<IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>::
        operator++((__normal_iterator<IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_> *)
                   &stack0xffffffffffffff80);
      }
      __gnu_cxx::
      __normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
      ::operator++(&local_60);
    }
  }
  return;
}

Assistant:

void deserialize_model(IsoForest &model, itype &in, std::vector<char> &buffer,
                       const bool diff_endian, const bool lacks_range_penalty,
                       const bool lacks_scoring_metric)
{
    if (interrupt_switch) return;

    if (lacks_range_penalty)
    {
        uint8_t data_en[3];
        read_bytes<uint8_t>((void*)data_en, (size_t)3, in);
        model.new_cat_action = (NewCategAction)data_en[0];
        model.cat_split_type = (CategSplit)data_en[1];
        model.missing_action = (MissingAction)data_en[2];
    }

    else
    {
        uint8_t data_en[4];
        read_bytes<uint8_t>((void*)data_en, (size_t)4, in);
        model.new_cat_action = (NewCategAction)data_en[0];
        model.cat_split_type = (CategSplit)data_en[1];
        model.missing_action = (MissingAction)data_en[2];
        model.has_range_penalty = (bool)data_en[3];
    }

    if (lacks_scoring_metric)
    {
        model.scoring_metric = Depth;
    }

    else
    {
        uint8_t data_en;
        read_bytes<uint8_t>((void*)&data_en, (size_t)1, in);
        model.scoring_metric = (ScoringMetric)data_en;
    }

    double data_doubles[2];
    read_bytes<double, double>((void*)data_doubles, (size_t)2, in, buffer, diff_endian);
    model.exp_avg_depth = data_doubles[0];
    model.exp_avg_sep = data_doubles[1];

    size_t data_sizets[2];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)2, in, buffer, diff_endian);
    model.orig_sample_size = data_sizets[0];
    model.trees.resize(data_sizets[1]);
    model.trees.shrink_to_fit();

    size_t veclen;
    for (auto &tree : model.trees) {
        read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer, diff_endian);
        tree.resize(veclen);
        tree.shrink_to_fit();
        for (auto &node : tree)
            deserialize_node<itype, saved_int_t, saved_size_t>(node, in, buffer, diff_endian);
    }
}